

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

int __thiscall ON_Xform::IsSimilarity(ON_Xform *this,double tol)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  double d;
  ON_Interval Spectrum;
  double I [4] [4];
  double local_138;
  double local_130;
  ON_Interval local_128;
  ON_Xform local_118;
  double local_98 [17];
  
  bVar5 = 0;
  bVar1 = IsAffine(this);
  iVar3 = 0;
  if (bVar1) {
    pOVar4 = &local_118;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar4->m_xform[0][0] = this->m_xform[0][0];
      this = (ON_Xform *)((long)this + ((ulong)bVar5 * -2 + 1) * 8);
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    iVar3 = 0;
    local_118.m_xform[1][3] = 0.0;
    local_118.m_xform[0][3] = 0.0;
    local_118.m_xform[2][3] = 0.0;
    local_118.m_xform[3][0] = 0.0;
    local_118.m_xform[3][1] = 0.0;
    local_118.m_xform[3][2] = 0.0;
    local_118.m_xform[3][3] = 1.0;
    local_128 = ApproxSpectrumLTL(&local_118);
    dVar6 = ON_Interval::Mid(&local_128);
    dVar7 = ON_Interval::Length(&local_128);
    if ((dVar7 * 0.5 < tol) && (dVar7 * 0.5 < ABS(dVar6))) {
      local_130 = 0.0;
      Inv((double *)&local_118,(double (*) [4])local_98,&local_130,&local_138);
      iVar3 = (uint)(0.0 < (double)(~-(ulong)(local_130 != 0.0) & (ulong)local_130 |
                                   (ulong)(1.0 / local_130) & -(ulong)(local_130 != 0.0))) * 2 + -1;
    }
  }
  return iVar3;
}

Assistant:

int ON_Xform::IsSimilarity(double tol) const
{
	// This function does not construct a similarity transformation,
	// ( see ON_Xform::DecomposeSimilarity() for this ).  It merely
	// indicates that this transformation is sufficiently close to a similarity.
	// However using with a tight tolerance like tol<ON_ZERO_TOLERANCE 
	// Indicates that this is very close to being a similar transformation.
	// This calculations is based on approximations and is only  
	// reliable if tolerance << 1.0. 
	int rval = 0;
	if (IsAffine())
	{
		// L = Linear component of this. 
		// LTL = L^T * L
		//  *this is similar iff Spectrum(LTL) = lambda, for real lambda!=0.0
		ON_Xform L = (*this);
		L.Linearize();


		ON_Interval Spectrum = ApproxSpectrumLTL(L);
		double lambda = Spectrum.Mid();
		double dist = Spectrum.Length() / 2.0;
		if (dist < tol && fabs(lambda)>dist )
		{
			double det = L.Determinant();
			rval = (det > 0) ? 1 : -1;
		}
	}
	return rval;
}